

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O2

void __thiscall GlobOpt::TrackCalls(GlobOpt *this,Instr *instr)

{
  Instr **ppIVar1;
  uint *puVar2;
  undefined1 *puVar3;
  OpCode OVar4;
  BasicBlock *pBVar5;
  Instr *this_00;
  Opnd *this_01;
  code *pcVar6;
  bool bVar7;
  uint uVar8;
  uint32 uVar9;
  uint32 uVar10;
  undefined4 *puVar11;
  RegOpnd *pRVar12;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *pSVar13;
  Instr **ppIVar14;
  Instr *pIVar15;
  SymOpnd *pSVar16;
  StackSym *pSVar17;
  ByteCodeUsesInstr *this_02;
  Func *pFVar18;
  InlineeFrameInfo *pIVar19;
  Sym *pSVar20;
  GlobOptBlockData *pGVar21;
  Value *pVVar22;
  BVSparse<Memory::JitArenaAllocator> *pBVar23;
  uint uVar24;
  Func *pFVar25;
  Instr *instrToMove;
  Instr *this_03;
  Instr *pIVar26;
  Instr *pIVar27;
  Opnd *local_38;
  
  OVar4 = instr->m_opcode;
  switch(OVar4) {
  case BytecodeArgOutCapture:
    local_38 = instr->m_dst;
    SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Prepend
              ((this->currentBlock->globOptData).callSequence,&this->alloc->super_ArenaAllocator,
               &local_38);
    puVar2 = &(this->currentBlock->globOptData).argOutCount;
    *puVar2 = *puVar2 + 1;
    break;
  case BytecodeArgOutUse:
  case ByteCodeUses:
  case BailOutStackRestore:
  case NoImplicitCallUses:
  case NoIntOverflowBoundary:
switchD_0045dd5c_caseD_243:
    bVar7 = OpCodeAttr::CallInstr(OVar4);
    if (((bVar7) && (EndTrackCall(this,instr), (this->field_0xf4 & 0x10) != 0)) &&
       ((OVar4 = instr->m_opcode, OVar4 == CallI ||
        (((OVar4 == CallIDynamic || (OVar4 == CallIFixed)) || (OVar4 == CallDirect)))))) {
switchD_0045dd5c_caseD_248:
      EndTrackCall(this,instr);
      return;
    }
    break;
  case EndCallForPolymorphicInlinee:
    goto switchD_0045dd5c_caseD_248;
  case InlineeStart:
    pFVar18 = instr->m_func;
    pFVar25 = pFVar18->parentFunc;
    if (pFVar25 != (this->currentBlock->globOptData).curFunc) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x252,
                         "(instr->m_func->GetParentFunc() == this->currentBlock->globOptData.curFunc)"
                         ,
                         "instr->m_func->GetParentFunc() == this->currentBlock->globOptData.curFunc"
                        );
      if (!bVar7) goto LAB_0045e541;
      *puVar11 = 0;
      pFVar18 = instr->m_func;
      pFVar25 = pFVar18->parentFunc;
    }
    if (pFVar25 == (Func *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x253,"(instr->m_func->GetParentFunc())","instr->m_func->GetParentFunc()")
      ;
      if (!bVar7) goto LAB_0045e541;
      *puVar11 = 0;
      pFVar18 = instr->m_func;
    }
    pBVar5 = this->currentBlock;
    (pBVar5->globOptData).curFunc = pFVar18;
    Func::UpdateMaxInlineeArgOutSize(this->func,(pBVar5->globOptData).inlinedArgOutSize);
    EndTrackCall(this,instr);
    pIVar19 = InlineeFrameInfo::New(instr->m_func->m_alloc);
    pSVar20 = IR::Opnd::GetSym(instr->m_src1);
    if (pSVar20 == (Sym *)0x0) {
      pVVar22 = (Value *)0x0;
    }
    else {
      pGVar21 = CurrentBlockData(this);
      pSVar20 = IR::Opnd::GetSym(instr->m_src1);
      pVVar22 = GlobOptBlockData::FindValue(pGVar21,pSVar20);
    }
    pIVar19->functionSymStartValue = pVVar22;
    pGVar21 = CurrentBlockData(this);
    pBVar23 = BVSparse<Memory::JitArenaAllocator>::CopyNew(pGVar21->liveFloat64Syms,this->alloc);
    pIVar19->floatSyms = pBVar23;
    pGVar21 = CurrentBlockData(this);
    pBVar23 = pGVar21->liveInt32Syms;
    pGVar21 = CurrentBlockData(this);
    pBVar23 = BVSparse<Memory::JitArenaAllocator>::MinusNew
                        (pBVar23,pGVar21->liveLossyInt32Syms,this->alloc);
    pIVar19->intSyms = pBVar23;
    pGVar21 = CurrentBlockData(this);
    pBVar23 = BVSparse<Memory::JitArenaAllocator>::CopyNew(pGVar21->liveVarSyms,this->alloc);
    pIVar19->varSyms = pBVar23;
    bVar7 = DoInlineArgsOpt(instr->m_func);
    if (bVar7) {
      puVar3 = &instr->m_func->field_0x240;
      *puVar3 = *puVar3 | 2;
      instr->m_func->frameInfo = pIVar19;
    }
    else {
      instr->m_func->cachedInlineeFrameInfo = pIVar19;
    }
    break;
  case InlineeEnd:
    ProcessInlineeEnd(this,instr);
    return;
  case InlineeMetaArg:
    bVar7 = IR::Opnd::IsSymOpnd(instr->m_dst);
    if (!bVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x27d,"(instr->GetDst()->IsSymOpnd())","instr->GetDst()->IsSymOpnd()");
      if (!bVar7) goto LAB_0045e541;
      *puVar11 = 0;
    }
    pSVar16 = IR::Opnd::AsSymOpnd(instr->m_dst);
    pSVar17 = Sym::AsStackSym(pSVar16->m_sym);
    bVar7 = StackSym::IsArgSlotSym(pSVar17);
    if (!bVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x27f,"(stackSym->IsArgSlotSym())","stackSym->IsArgSlotSym()");
      if (!bVar7) goto LAB_0045e541;
      *puVar11 = 0;
    }
    if (this->prePassLoop == (Loop *)0x0) {
      StackSym::FixupStackOffset(pSVar17,instr->m_func->parentFunc);
    }
    puVar2 = &(this->currentBlock->globOptData).inlinedArgOutSize;
    *puVar2 = *puVar2 + 8;
    break;
  case InlineBuiltInStart:
    this->field_0xf4 = this->field_0xf4 | 0x10;
    break;
  case InlineBuiltInEnd:
  case InlineNonTrackingBuiltInEnd:
    ppIVar1 = &instr->m_prev;
    ppIVar14 = ppIVar1;
    do {
      this_00 = *ppIVar14;
      ppIVar14 = &this_00->m_prev;
    } while (this_00->m_opcode != InlineBuiltInStart);
    this_03 = *ppIVar14;
    pIVar15 = *ppIVar1;
    pIVar27 = pIVar15;
    for (; (pIVar26 = pIVar15, pIVar15->m_opcode == ByteCodeUses ||
           (pIVar26 = pIVar27, pIVar15->m_opcode != InlineBuiltInStart)); pIVar15 = pIVar15->m_prev)
    {
      pIVar27 = pIVar26;
    }
    IR::Instr::Unlink(this_00);
    if (pIVar27 != *ppIVar1) {
      pIVar27 = pIVar27->m_prev;
    }
    IR::Instr::InsertBefore(pIVar27,this_00);
    pIVar15 = this_00->m_prev;
    if (this_03 != pIVar15) {
      while ((this_03->m_kind == InstrKindByteCodeUses && (this_03->m_opcode == ByteCodeUses))) {
        this_02 = IR::Instr::AsByteCodeUsesInstr(this_03);
        uVar9 = IR::Instr::GetByteCodeOffset(&this_02->super_Instr);
        uVar10 = IR::Instr::GetByteCodeOffset(this_00);
        if (uVar9 != uVar10) break;
        pIVar27 = this_03->m_prev;
        IR::Instr::Unlink(this_03);
        IR::Instr::InsertAfter(pIVar15,this_03);
        this_03 = pIVar27;
      }
    }
    if (instr->m_opcode == InlineBuiltInEnd) {
      EndTrackCall(this,instr);
    }
    uVar24 = (this->currentBlock->globOptData).inlinedArgOutSize;
    uVar8 = IR::Instr::GetArgOutSize(instr,false);
    if (uVar24 < uVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x2d2,
                         "(this->currentBlock->globOptData.inlinedArgOutSize >= instr->GetArgOutSize( false))"
                         ,
                         "this->currentBlock->globOptData.inlinedArgOutSize >= instr->GetArgOutSize( false)"
                        );
      if (!bVar7) goto LAB_0045e541;
      *puVar11 = 0;
    }
    uVar8 = IR::Instr::GetArgOutSize(instr,false);
    puVar2 = &(this->currentBlock->globOptData).inlinedArgOutSize;
    *puVar2 = *puVar2 - uVar8;
    this->field_0xf4 = this->field_0xf4 & 0xef;
    break;
  default:
    if ((3 < OVar4 - 0x1f0) && (1 < OVar4 - 0x1ed)) {
      if (OVar4 == InlineArrayPop) goto switchD_0045dd5c_caseD_248;
      if (OVar4 != ArgOut_A) {
        if ((OVar4 == IsInst) || (OVar4 == CallHelper)) {
          uVar24 = *(uint *)&this->field_0xf4;
          if ((uVar24 & 1) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar11 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                               ,0x273,"(this->isCallHelper)","this->isCallHelper");
            if (!bVar7) goto LAB_0045e541;
            *puVar11 = 0;
            uVar24 = *(uint *)&this->field_0xf4;
          }
          *(uint *)&this->field_0xf4 = uVar24 & 0xfffffffe;
          return;
        }
        if (OVar4 == StartCall) {
          if ((this->field_0xf4 & 1) != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar11 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                               ,0x20a,"(!this->isCallHelper)","!this->isCallHelper");
            if (!bVar7) goto LAB_0045e541;
            *puVar11 = 0;
          }
          bVar7 = IR::Opnd::IsRegOpnd(instr->m_dst);
          if (!bVar7) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar11 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                               ,0x20b,"(instr->GetDst()->IsRegOpnd())",
                               "instr->GetDst()->IsRegOpnd()");
            if (!bVar7) goto LAB_0045e541;
            *puVar11 = 0;
          }
          pRVar12 = IR::Opnd::AsRegOpnd(instr->m_dst);
          if ((pRVar12->m_sym->field_0x18 & 1) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar11 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                               ,0x20c,"(instr->GetDst()->AsRegOpnd()->m_sym->m_isSingleDef)",
                               "instr->GetDst()->AsRegOpnd()->m_sym->m_isSingleDef");
            if (!bVar7) goto LAB_0045e541;
            *puVar11 = 0;
          }
          pSVar13 = (this->currentBlock->globOptData).callSequence;
          if (pSVar13 == (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            pSVar13 = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
                      new<Memory::JitArenaAllocator>(0x10,this->alloc,0x3d6ef4);
            (pSVar13->super_SListNodeBase<Memory::ArenaAllocator>).next = (Type)pSVar13;
            (pSVar13->super_RealCount).count = 0;
            (this->currentBlock->globOptData).callSequence = pSVar13;
          }
          local_38 = instr->m_dst;
          SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                    (pSVar13,&this->alloc->super_ArenaAllocator,&local_38);
          uVar8 = IR::Instr::GetArgOutCount(instr,true);
          pBVar5 = this->currentBlock;
          puVar2 = &(pBVar5->globOptData).totalOutParamCount;
          *puVar2 = *puVar2 + uVar8;
          puVar2 = &(pBVar5->globOptData).startCallCount;
          *puVar2 = *puVar2 + 1;
          return;
        }
        goto switchD_0045dd5c_caseD_243;
      }
    }
    this_01 = instr->m_dst;
    bVar7 = IR::Opnd::IsSymOpnd(this_01);
    if (bVar7) {
      if ((this->field_0xf4 & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x229,"(!this->isCallHelper)","!this->isCallHelper");
        if (!bVar7) goto LAB_0045e541;
        *puVar11 = 0;
      }
      pSVar13 = (this->currentBlock->globOptData).callSequence;
      if ((SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
          (pSVar13->super_SListNodeBase<Memory::ArenaAllocator>).next == pSVar13) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x22a,"(!this->currentBlock->globOptData.callSequence->Empty())",
                           "!this->currentBlock->globOptData.callSequence->Empty()");
        if (!bVar7) goto LAB_0045e541;
        *puVar11 = 0;
      }
      pSVar16 = IR::Opnd::AsSymOpnd(this_01);
      pSVar17 = Sym::AsStackSym(pSVar16->m_sym);
      if (((pSVar17->field_0x1b & 2) == 0) && (instr->m_opcode != ArgOut_A_FixupForStackArgs)) {
        local_38 = instr->m_dst;
        SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                  ((this->currentBlock->globOptData).callSequence,&this->alloc->super_ArenaAllocator
                   ,&local_38);
        puVar2 = &(this->currentBlock->globOptData).argOutCount;
        *puVar2 = *puVar2 + 1;
      }
      bVar7 = StackSym::IsArgSlotSym(pSVar17);
      if (!bVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x234,"(stackSym->IsArgSlotSym())","stackSym->IsArgSlotSym()");
        if (!bVar7) {
LAB_0045e541:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar11 = 0;
      }
      if ((pSVar17->field_0x19 & 0x40) != 0) {
        uVar24 = 8;
        if (8 < (uint)TySize[instr->m_dst->m_type]) {
          uVar24 = TySize[instr->m_dst->m_type];
        }
        puVar2 = &(this->currentBlock->globOptData).inlinedArgOutSize;
        *puVar2 = *puVar2 + uVar24;
        if ((this->prePassLoop == (Loop *)0x0) && (-1 < pSVar17->m_offset)) {
          StackSym::FixupStackOffset(pSVar17,instr->m_func);
        }
      }
    }
    else {
      bVar7 = IR::Opnd::IsRegOpnd(this_01);
      if (!bVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x245,"(opnd->IsRegOpnd())","opnd->IsRegOpnd()");
        if (!bVar7) goto LAB_0045e541;
        *puVar11 = 0;
      }
      this->field_0xf4 = this->field_0xf4 | 1;
    }
    if ((instr->m_opcode == ArgOut_A_FixupForStackArgs) && (this->prePassLoop == (Loop *)0x0)) {
      instr->m_opcode = ArgOut_A_Inline;
    }
  }
  return;
}

Assistant:

void
GlobOpt::TrackCalls(IR::Instr * instr)
{
    // Keep track of out params for bailout
    switch (instr->m_opcode)
    {
    case Js::OpCode::StartCall:
        Assert(!this->isCallHelper);
        Assert(instr->GetDst()->IsRegOpnd());
        Assert(instr->GetDst()->AsRegOpnd()->m_sym->m_isSingleDef);

        if (this->currentBlock->globOptData.callSequence == nullptr)
        {
            this->currentBlock->globOptData.callSequence = JitAnew(this->alloc, SListBase<IR::Opnd *>);
        }
        this->currentBlock->globOptData.callSequence->Prepend(this->alloc, instr->GetDst());

        this->currentBlock->globOptData.totalOutParamCount += instr->GetArgOutCount(/*getInterpreterArgOutCount*/ true);
        this->currentBlock->globOptData.startCallCount++;

        break;
    case Js::OpCode::BytecodeArgOutCapture:
        {
            this->currentBlock->globOptData.callSequence->Prepend(this->alloc, instr->GetDst());
            this->currentBlock->globOptData.argOutCount++;
            break;
        }
    case Js::OpCode::ArgOut_A:
    case Js::OpCode::ArgOut_A_Inline:
    case Js::OpCode::ArgOut_A_FixupForStackArgs:
    case Js::OpCode::ArgOut_A_InlineBuiltIn:
    case Js::OpCode::ArgOut_A_Dynamic:
    case Js::OpCode::ArgOut_A_FromStackArgs:
    case Js::OpCode::ArgOut_A_SpreadArg:
    {
        IR::Opnd * opnd = instr->GetDst();
        if (opnd->IsSymOpnd())
        {
            Assert(!this->isCallHelper);
            Assert(!this->currentBlock->globOptData.callSequence->Empty());
            StackSym* stackSym = opnd->AsSymOpnd()->m_sym->AsStackSym();

            // These scenarios are already tracked using BytecodeArgOutCapture,
            // and we don't want to be tracking ArgOut_A_FixupForStackArgs as these are only visible to the JIT and we should not be restoring them upon bailout.
            if (!stackSym->m_isArgCaptured && instr->m_opcode != Js::OpCode::ArgOut_A_FixupForStackArgs)
            {
                this->currentBlock->globOptData.callSequence->Prepend(this->alloc, instr->GetDst());
                this->currentBlock->globOptData.argOutCount++;
            }
            Assert(stackSym->IsArgSlotSym());
            if (stackSym->m_isInlinedArgSlot)
            {
                uint size = TySize[instr->GetDst()->GetType()];
                this->currentBlock->globOptData.inlinedArgOutSize += size < MachPtr ? MachPtr : size;
                // We want to update the offsets only once: don't do in prepass.
                if (!this->IsLoopPrePass() && stackSym->m_offset >= 0)
                {
                    Func * currentFunc = instr->m_func;
                    stackSym->FixupStackOffset(currentFunc);
                }
            }
        }
        else
        {
            // It is a reg opnd if it is a helper call
            // It should be all ArgOut until the CallHelper instruction
            Assert(opnd->IsRegOpnd());
            this->isCallHelper = true;
        }

        if (instr->m_opcode == Js::OpCode::ArgOut_A_FixupForStackArgs && !this->IsLoopPrePass())
        {
            instr->m_opcode = Js::OpCode::ArgOut_A_Inline;
        }
        break;
    }

    case Js::OpCode::InlineeStart:
    {
        Assert(instr->m_func->GetParentFunc() == this->currentBlock->globOptData.curFunc);
        Assert(instr->m_func->GetParentFunc());
        this->currentBlock->globOptData.curFunc = instr->m_func;

        this->func->UpdateMaxInlineeArgOutSize(this->currentBlock->globOptData.inlinedArgOutSize);
        this->EndTrackCall(instr);

        InlineeFrameInfo* inlineeFrameInfo = InlineeFrameInfo::New(instr->m_func->m_alloc);
        inlineeFrameInfo->functionSymStartValue = instr->GetSrc1()->GetSym() ?
            CurrentBlockData()->FindValue(instr->GetSrc1()->GetSym()) : nullptr;
        inlineeFrameInfo->floatSyms = CurrentBlockData()->liveFloat64Syms->CopyNew(this->alloc);
        inlineeFrameInfo->intSyms = CurrentBlockData()->liveInt32Syms->MinusNew(CurrentBlockData()->liveLossyInt32Syms, this->alloc);
        inlineeFrameInfo->varSyms = CurrentBlockData()->liveVarSyms->CopyNew(this->alloc);

        if (DoInlineArgsOpt(instr->m_func))
        {
            instr->m_func->m_hasInlineArgsOpt = true;
            instr->m_func->frameInfo = inlineeFrameInfo;
        }
        else
        {
            instr->m_func->cachedInlineeFrameInfo = inlineeFrameInfo;
        }
        break;
    }

    case Js::OpCode::EndCallForPolymorphicInlinee:
        // Have this opcode mimic the functions of both InlineeStart and InlineeEnd in the bailout block of a polymorphic call inlined using fixed methods.
        this->EndTrackCall(instr);
        break;

    case Js::OpCode::CallHelper:
    case Js::OpCode::IsInst:
        Assert(this->isCallHelper);
        this->isCallHelper = false;
        break;

    case Js::OpCode::InlineeEnd:
        ProcessInlineeEnd(instr);
        break;

    case Js::OpCode::InlineeMetaArg:
    {
        Assert(instr->GetDst()->IsSymOpnd());
        StackSym * stackSym = instr->GetDst()->AsSymOpnd()->m_sym->AsStackSym();
        Assert(stackSym->IsArgSlotSym());

        // InlineeMetaArg has the m_func set as the "inlinee" and not the "inliner"
        // TODO: Review this and fix the m_func of InlineeMetaArg to be "inliner" (as for the rest of the ArgOut's)
        // We want to update the offsets only once: don't do in prepass.
        if (!this->IsLoopPrePass())
        {
            Func * currentFunc = instr->m_func->GetParentFunc();
            stackSym->FixupStackOffset(currentFunc);
        }
        this->currentBlock->globOptData.inlinedArgOutSize += MachPtr;
        break;
    }

    case Js::OpCode::InlineBuiltInStart:
        this->inInlinedBuiltIn = true;
        break;

    case Js::OpCode::InlineNonTrackingBuiltInEnd:
    case Js::OpCode::InlineBuiltInEnd:
    {
        // If extra bailouts were added for the InlineMathXXX call itself,
        // move InlineeBuiltInStart just above the InlineMathXXX.
        // This is needed so that the function argument has lifetime after all bailouts for InlineMathXXX,
        // otherwise when we bailout we would get wrong function.
        IR::Instr* inlineBuiltInStartInstr = instr->m_prev;
        while (inlineBuiltInStartInstr->m_opcode != Js::OpCode::InlineBuiltInStart)
        {
            inlineBuiltInStartInstr = inlineBuiltInStartInstr->m_prev;
        }

        IR::Instr *byteCodeUsesInstr = inlineBuiltInStartInstr->m_prev;
        IR::Instr * insertBeforeInstr = instr->m_prev;
        IR::Instr * tmpInstr = insertBeforeInstr;
        while(tmpInstr->m_opcode != Js::OpCode::InlineBuiltInStart )
        {
            if(tmpInstr->m_opcode == Js::OpCode::ByteCodeUses)
            {
                insertBeforeInstr = tmpInstr;
            }
            tmpInstr = tmpInstr->m_prev;
        }
        inlineBuiltInStartInstr->Unlink();
        if(insertBeforeInstr == instr->m_prev)
        {
            insertBeforeInstr->InsertBefore(inlineBuiltInStartInstr);
        }

        else
        {
            insertBeforeInstr->m_prev->InsertBefore(inlineBuiltInStartInstr);
        }

        // Need to move the byte code uses instructions associated with inline built-in start instruction as well. For instance,
        // copy-prop may have replaced the function sym and inserted a byte code uses for the original sym holding the function.
        // That byte code uses instruction needs to appear after bailouts inserted for the InlinMathXXX instruction since the
        // byte code register holding the function object needs to be restored on bailout.
        IR::Instr *const insertByteCodeUsesAfterInstr = inlineBuiltInStartInstr->m_prev;
        if(byteCodeUsesInstr != insertByteCodeUsesAfterInstr)
        {
            // The InlineBuiltInStart instruction was moved, look for its ByteCodeUses instructions that also need to be moved
            while(
                byteCodeUsesInstr->IsByteCodeUsesInstr() &&
                byteCodeUsesInstr->AsByteCodeUsesInstr()->GetByteCodeOffset() == inlineBuiltInStartInstr->GetByteCodeOffset())
            {
                IR::Instr *const instrToMove = byteCodeUsesInstr;
                byteCodeUsesInstr = byteCodeUsesInstr->m_prev;
                instrToMove->Unlink();
                insertByteCodeUsesAfterInstr->InsertAfter(instrToMove);
            }
        }

        // The following code makes more sense to be processed when we hit InlineeBuiltInStart,
        // but when extra bailouts are added for the InlineMathXXX and InlineArrayPop instructions itself, those bailouts
        // need to know about current bailout record, but since they are added after TrackCalls is called
        // for InlineeBuiltInStart, we can't clear current record when got InlineeBuiltInStart

        // Do not track calls for InlineNonTrackingBuiltInEnd, as it is already tracked for InlineArrayPop
        if(instr->m_opcode == Js::OpCode::InlineBuiltInEnd)
        {
            this->EndTrackCall(instr);
        }

        Assert(this->currentBlock->globOptData.inlinedArgOutSize >= instr->GetArgOutSize(/*getInterpreterArgOutCount*/ false));
        this->currentBlock->globOptData.inlinedArgOutSize -= instr->GetArgOutSize(/*getInterpreterArgOutCount*/ false);

        this->inInlinedBuiltIn = false;
        break;
    }

    case Js::OpCode::InlineArrayPop:
    {
        // EndTrackCall should be called here as the Post-op BailOutOnImplicitCalls will bail out to the instruction after the Pop function call instr.
        // This bailout shouldn't be tracking the call sequence as it will then erroneously reserve stack space for arguments when the call would have already happened
        // Can't wait till InlineBuiltinEnd like we do for other InlineMathXXX because by then we would have filled bailout info for the BailOutOnImplicitCalls for InlineArrayPop.
        this->EndTrackCall(instr);
        break;
    }

    default:
        if (OpCodeAttr::CallInstr(instr->m_opcode))
        {
            this->EndTrackCall(instr);
            // With `InlineeBuiltInStart` and `InlineeBuiltInEnd` surrounding CallI/CallIDirect/CallIDynamic/CallIFixed,
            // we are not popping the call sequence correctly. That makes the bailout code thinks that we need to restore
            // argouts of the remaining call even though we shouldn't.
            // Also see Inline::InlineApplyWithArgumentsObject,  Inline::InlineApplyWithoutArrayArgument, Inline::InlineCall
            // in which we set the end tag instruction's opcode to InlineNonTrackingBuiltInEnd
            if (this->inInlinedBuiltIn &&
                (instr->m_opcode == Js::OpCode::CallDirect || instr->m_opcode == Js::OpCode::CallI ||
                 instr->m_opcode == Js::OpCode::CallIDynamic || instr->m_opcode == Js::OpCode::CallIFixed))
            {
                // We can end up in this situation when a built-in apply target is inlined to a CallDirect. We have the following IR:
                //
                // StartCall
                // ArgOut_InlineBuiltIn
                // ArgOut_InlineBuiltIn
                // ArgOut_InlineBuiltIn
                // InlineBuiltInStart
                //      ArgOut_A_InlineSpecialized
                //      ArgOut_A
                //      ArgOut_A
                //      CallDirect
                // InlineNonTrackingBuiltInEnd
                //
                // We need to call EndTrackCall twice for CallDirect in this case. The CallDirect may get a BailOutOnImplicitCalls later,
                // but it should not be tracking the call sequence for the apply call as it is a post op bailout and the call would have
                // happened when we bail out.
                // Can't wait till InlineBuiltinEnd like we do for other InlineMathXXX because by then we would have filled bailout info for the BailOutOnImplicitCalls for CallDirect.
                this->EndTrackCall(instr);
            }
        }
        break;
    }
}